

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<float> * __thiscall cimg_library::CImg<float>::fill(CImg<float> *this,float *val)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  float *__s;
  
  __s = this->_data;
  if ((((__s != (float *)0x0) && (uVar2 = this->_width, uVar2 != 0)) &&
      (uVar3 = this->_height, uVar3 != 0)) &&
     ((uVar4 = this->_depth, uVar4 != 0 && (this->_spectrum != 0)))) {
    if ((*val != 0.0) || (NAN(*val))) {
      lVar5 = (ulong)uVar4 * (ulong)this->_spectrum * (ulong)uVar3 * (ulong)uVar2;
      if (0 < lVar5) {
        pfVar1 = __s + lVar5;
        do {
          *__s = *val;
          __s = __s + 1;
        } while (__s < pfVar1);
      }
    }
    else {
      memset(__s,0,(ulong)uVar4 * (ulong)this->_spectrum * (ulong)uVar2 * (ulong)uVar3 * 4);
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T& val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)(ulongT)val,sizeof(T)*size()); // Double cast to allow val to be (void*)
      return *this;
    }